

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.hpp
# Opt level: O3

void nestl::test::
     CheckSetSize<nestl::impl::set<int,std::less<int>,nestl::test::minimal_allocator<int>>>
               (set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *s,
               size_t expectedSize)

{
  base_ptr prVar1;
  base_ptr prVar2;
  base_ptr prVar3;
  rb_tree_node_base *prVar4;
  size_t dist;
  size_t cdist;
  unsigned_long local_18;
  size_t local_10;
  size_t local_8;
  
  local_18 = (s->m_impl).m_impl.m_node_count;
  local_10 = expectedSize;
  if (local_18 != expectedSize) {
    detail::print_tuple<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((ostream *)&std::cerr,(char (*) [16])"expected size: ",&local_10,
               (char (*) [8])", got: ",&local_18);
    abort();
  }
  prVar1 = (s->m_impl).m_impl.m_header.m_left;
  prVar4 = &(s->m_impl).m_impl.m_header;
  if (prVar1 == prVar4) {
    local_18 = 0;
    if (expectedSize != 0) goto LAB_00105003;
  }
  else {
    local_18 = 0;
    prVar3 = prVar1;
    do {
      prVar2 = prVar3->m_right;
      if (prVar3->m_right == (base_ptr)0x0) {
        do {
          prVar2 = prVar3;
          prVar3 = prVar2->m_parent;
        } while (prVar2 == prVar3->m_right);
        if (prVar2->m_right == prVar3) {
          prVar3 = prVar2;
        }
      }
      else {
        do {
          prVar3 = prVar2;
          prVar2 = prVar3->m_left;
        } while (prVar3->m_left != (base_ptr)0x0);
      }
      local_18 = local_18 + 1;
    } while (prVar3 != prVar4);
    if (local_18 != expectedSize) {
LAB_00105003:
      detail::
      print_tuple<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
                ((ostream *)&std::cerr,(char (*) [38])"distance between iterators should be ",
                 &local_10,(char (*) [16])" elements, got ",&local_18,(char (*) [10])" elements");
      abort();
    }
    if (prVar1 != prVar4) {
      local_8 = 0;
      do {
        prVar3 = prVar1->m_right;
        if (prVar1->m_right == (base_ptr)0x0) {
          do {
            prVar3 = prVar1;
            prVar1 = prVar3->m_parent;
          } while (prVar3 == prVar1->m_right);
          if (prVar3->m_right == prVar1) {
            prVar1 = prVar3;
          }
        }
        else {
          do {
            prVar1 = prVar3;
            prVar3 = prVar1->m_left;
          } while (prVar1->m_left != (base_ptr)0x0);
        }
        local_8 = local_8 + 1;
      } while (prVar1 != prVar4);
      goto LAB_00104fca;
    }
  }
  local_8 = 0;
LAB_00104fca:
  if (local_8 != expectedSize) {
    detail::
    print_tuple<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((ostream *)&std::cerr,(char (*) [44])"distance between const iterators should be ",
               &local_10,(char (*) [16])" elements, got ",&local_8,(char (*) [10])" elements");
    abort();
  }
  return;
}

Assistant:

void CheckSetSize(const Set& s, size_t expectedSize)
{
    if (s.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", s.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool setIsEmpty = s.empty();

    if (setIsEmpty != shouldBeEmpty)
    {
        fatal_failure("set empty method returns ", setIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(s.begin(), s.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(s.cbegin(), s.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be " ,expectedSize, " elements, got ", cdist, " elements");
    }
}